

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  XmlFormatting XVar4;
  XmlWriter *pXVar5;
  StringRef text;
  byte local_389;
  SourceLineInfo local_378;
  allocator<char> local_361;
  string local_360;
  StringRef local_340;
  SourceLineInfo local_330;
  allocator<char> local_319;
  string local_318;
  StringRef local_2f8;
  allocator<char> local_2e1;
  string local_2e0 [32];
  undefined1 local_2c0 [32];
  SourceLineInfo local_2a0;
  allocator<char> local_289;
  string local_288;
  StringRef local_268;
  SourceLineInfo local_258;
  allocator<char> local_241;
  string local_240;
  string local_220;
  StringRef local_200;
  allocator<char> local_1e9;
  string local_1e8 [32];
  undefined1 local_1c8 [16];
  string local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_198;
  allocator<char> local_181;
  string local_180 [32];
  undefined1 local_160 [16];
  SourceLineInfo local_150;
  StringRef local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_130;
  StringRef local_120;
  allocator<char> local_109;
  string local_108;
  StringRef local_e8;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  ScopedElement t_1;
  allocator<char> local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  ScopedElement t;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  bool includeResults;
  AssertionResult *result;
  AssertionStats *assertionStats_local;
  XmlReporter *this_local;
  
  uVar2 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  local_389 = 1;
  if ((uVar2 & 1) == 0) {
    bVar1 = AssertionResult::isOk(&assertionStats->assertionResult);
    local_389 = bVar1 ^ 0xff;
  }
  local_389 = local_389 & 1;
  if ((local_389 != 0) ||
     (OVar3 = AssertionResult::getResultType(&assertionStats->assertionResult), OVar3 == Warning)) {
    __end2 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                       (&assertionStats->infoMessages);
    msg = (MessageInfo *)
          std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                    (&assertionStats->infoMessages);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                       *)&msg), bVar1) {
      t._8_8_ = __gnu_cxx::
                __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                ::operator*(&__end2);
      if ((((reference)t._8_8_)->type == Info) && (local_389 != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_78,"Info",&local_79);
        operator|(Newline,Indent);
        XmlWriter::scopedElement
                  ((XmlWriter *)local_58,(string *)&this->m_xml,(XmlFormatting)local_78);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator(&local_79);
        writeSourceInfo(this,(SourceLineInfo *)(t._8_8_ + 0x30));
        StringRef::StringRef((StringRef *)&t_1.m_fmt,(string *)(t._8_8_ + 0x10));
        XVar4 = operator|(Newline,Indent);
        XmlWriter::ScopedElement::writeText((ScopedElement *)local_58,stack0xffffffffffffff60,XVar4)
        ;
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_58);
      }
      else if (((reference)t._8_8_)->type == Warning) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_d0,"Warning",&local_d1);
        operator|(Newline,Indent);
        XmlWriter::scopedElement
                  ((XmlWriter *)local_b0,(string *)&this->m_xml,(XmlFormatting)local_d0);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator(&local_d1);
        writeSourceInfo(this,(SourceLineInfo *)(t._8_8_ + 0x30));
        StringRef::StringRef(&local_e8,(string *)(t._8_8_ + 0x10));
        XVar4 = operator|(Newline,Indent);
        XmlWriter::ScopedElement::writeText((ScopedElement *)local_b0,local_e8,XVar4);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b0);
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
      ::operator++(&__end2);
    }
  }
  if (((local_389 != 0) ||
      (OVar3 = AssertionResult::getResultType(&assertionStats->assertionResult), OVar3 == Warning))
     || (OVar3 = AssertionResult::getResultType(&assertionStats->assertionResult),
        OVar3 == ExplicitSkip)) {
    bVar1 = AssertionResult::hasExpression(&assertionStats->assertionResult);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expression",&local_109);
      XVar4 = operator|(Newline,Indent);
      pXVar5 = XmlWriter::startElement(&this->m_xml,&local_108,XVar4);
      local_120 = operator____sr("success",7);
      bVar1 = AssertionResult::succeeded(&assertionStats->assertionResult);
      pXVar5 = XmlWriter::writeAttribute(pXVar5,local_120,bVar1);
      local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                   )operator____sr("type",4);
      local_140 = AssertionResult::getTestMacroName(&assertionStats->assertionResult);
      XmlWriter::writeAttribute(pXVar5,(StringRef)local_130,local_140);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      local_150 = AssertionResult::getSourceInfo(&assertionStats->assertionResult);
      writeSourceInfo(this,&local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_180,"Original",&local_181);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)local_160,(string *)&this->m_xml,(XmlFormatting)local_180);
      AssertionResult::getExpression_abi_cxx11_
                ((string *)(local_1c8 + 0x10),&assertionStats->assertionResult);
      StringRef::StringRef((StringRef *)&local_198,(string *)(local_1c8 + 0x10));
      XVar4 = operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_160,(StringRef)local_198,XVar4);
      std::__cxx11::string::~string((string *)(local_1c8 + 0x10));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_160);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator(&local_181);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1e8,"Expanded",&local_1e9);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)local_1c8,(string *)&this->m_xml,(XmlFormatting)local_1e8);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_220,&assertionStats->assertionResult)
      ;
      StringRef::StringRef(&local_200,&local_220);
      XVar4 = operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_1c8,local_200,XVar4);
      std::__cxx11::string::~string((string *)&local_220);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1c8);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
    }
    OVar3 = AssertionResult::getResultType(&assertionStats->assertionResult);
    if (OVar3 == Info) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2e0,"Info",&local_2e1);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)local_2c0,(string *)&this->m_xml,(XmlFormatting)local_2e0);
      local_2f8 = AssertionResult::getMessage(&assertionStats->assertionResult);
      XVar4 = operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_2c0,local_2f8,XVar4);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_2c0);
      std::__cxx11::string::~string(local_2e0);
      std::allocator<char>::~allocator(&local_2e1);
    }
    else if (OVar3 != Warning) {
      if (OVar3 == ExplicitSkip) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Skip",&local_361);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::startElement(&this->m_xml,&local_360,XVar4);
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator(&local_361);
        local_378 = AssertionResult::getSourceInfo(&assertionStats->assertionResult);
        writeSourceInfo(this,&local_378);
        text = AssertionResult::getMessage(&assertionStats->assertionResult);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::writeText(&this->m_xml,text,XVar4);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::endElement(&this->m_xml,XVar4);
      }
      else if (OVar3 == ExplicitFailure) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,"Failure",&local_319);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::startElement(&this->m_xml,&local_318,XVar4);
        std::__cxx11::string::~string((string *)&local_318);
        std::allocator<char>::~allocator(&local_319);
        local_330 = AssertionResult::getSourceInfo(&assertionStats->assertionResult);
        writeSourceInfo(this,&local_330);
        local_340 = AssertionResult::getMessage(&assertionStats->assertionResult);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::writeText(&this->m_xml,local_340,XVar4);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::endElement(&this->m_xml,XVar4);
      }
      else if (OVar3 == ThrewException) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,"Exception",&local_241);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::startElement(&this->m_xml,&local_240,XVar4);
        std::__cxx11::string::~string((string *)&local_240);
        std::allocator<char>::~allocator(&local_241);
        local_258 = AssertionResult::getSourceInfo(&assertionStats->assertionResult);
        writeSourceInfo(this,&local_258);
        local_268 = AssertionResult::getMessage(&assertionStats->assertionResult);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::writeText(&this->m_xml,local_268,XVar4);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::endElement(&this->m_xml,XVar4);
      }
      else if (OVar3 == FatalErrorCondition) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_288,"FatalErrorCondition",&local_289);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::startElement(&this->m_xml,&local_288,XVar4);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator(&local_289);
        local_2a0 = AssertionResult::getSourceInfo(&assertionStats->assertionResult);
        writeSourceInfo(this,&local_2a0);
        local_2c0._16_16_ =
             (undefined1  [16])AssertionResult::getMessage(&assertionStats->assertionResult);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::writeText(&this->m_xml,(StringRef)local_2c0._16_16_,XVar4);
        XVar4 = operator|(Newline,Indent);
        XmlWriter::endElement(&this->m_xml,XVar4);
      }
    }
    bVar1 = AssertionResult::hasExpression(&assertionStats->assertionResult);
    if (bVar1) {
      XVar4 = operator|(Newline,Indent);
      XmlWriter::endElement(&this->m_xml,XVar4);
    }
  }
  return;
}

Assistant:

void XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    auto t = m_xml.scopedElement( "Info" );
                    writeSourceInfo( msg.lineInfo );
                    t.writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    auto t = m_xml.scopedElement( "Warning" );
                    writeSourceInfo( msg.lineInfo );
                    t.writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if ( !includeResults && result.getResultType() != ResultWas::Warning &&
             result.getResultType() != ResultWas::ExplicitSkip ) {
            return;
        }

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success"_sr, result.succeeded() )
                .writeAttribute( "type"_sr, result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                     .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::ExplicitSkip:
                m_xml.startElement( "Skip" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();
    }